

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

string_maker<nonstd::vptr::value_ptr<int,nonstd::vptr::detail::default_clone<int>,std::default_delete<int>>>
* __thiscall
lest::
string_maker<nonstd::vptr::value_ptr<int,nonstd::vptr::detail::default_clone<int>,std::default_delete<int>>>
::to_string_abi_cxx11_
          (string_maker<nonstd::vptr::value_ptr<int,nonstd::vptr::detail::default_clone<int>,std::default_delete<int>>>
           *this,value_ptr<int,_nonstd::vptr::detail::default_clone<int>,_std::default_delete<int>_>
                 *value)

{
  ostream *os_00;
  string local_1c0 [48];
  ostringstream local_190 [8];
  ostringstream os;
  value_ptr<int,_nonstd::vptr::detail::default_clone<int>,_std::default_delete<int>_> *value_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  os_00 = (ostream *)std::ostream::operator<<(local_190,std::boolalpha);
  nonstd::vptr::operator<<(os_00,value);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::string((string *)this,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return this;
}

Assistant:

static std::string to_string( T const & value )
    {
        std::ostringstream os; os << std::boolalpha << value;
        return os.str();
    }